

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

PyThreadState * pybind11::detail::get_thread_state_unchecked(void)

{
  PyThreadState *pPVar1;
  
  pPVar1 = (PyThreadState *)_PyThreadState_UncheckedGet();
  return pPVar1;
}

Assistant:

inline PyThreadState *get_thread_state_unchecked() {
#if defined(PYPY_VERSION)
    return PyThreadState_GET();
#elif PY_VERSION_HEX < 0x030D0000
    return _PyThreadState_UncheckedGet();
#else
    return PyThreadState_GetUnchecked();
#endif
}